

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<VkSpecParser::Command>::relocate
          (QArrayDataPointer<VkSpecParser::Command> *this,qsizetype offset,Command **data)

{
  bool bVar1;
  Command *in_RDX;
  long in_RSI;
  Command *in_RDI;
  Command **unaff_retaddr;
  Command *res;
  char16_t *n;
  Command *c;
  
  n = (in_RDI->cmd).name.d.ptr + in_RSI * 0x34;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<VkSpecParser::Command,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (Command *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<VkSpecParser::Command>,VkSpecParser::Command_const*>
                        (unaff_retaddr,(QArrayDataPointer<VkSpecParser::Command> *)c), bVar1)) {
    (in_RDX->cmd).name.d.d = (Data *)(in_RSI * 0x68 + (long)(in_RDX->cmd).name.d.d);
  }
  (in_RDI->cmd).name.d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }